

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

int SSE8x8_C(uint8_t *a,uint8_t *b)

{
  int iVar1;
  
  iVar1 = GetSSE(a,b,8,8);
  return iVar1;
}

Assistant:

static int SSE8x8_C(const uint8_t* a, const uint8_t* b) {
  return GetSSE(a, b, 8, 8);
}